

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O2

void __thiscall
Minisat::RegionAllocator<unsigned_int>::moveTo
          (RegionAllocator<unsigned_int> *this,RegionAllocator<unsigned_int> *to)

{
  uint32_t uVar1;
  
  free(to->memory);
  to->memory = this->memory;
  uVar1 = this->cap;
  to->sz = this->sz;
  to->cap = uVar1;
  to->wasted_ = this->wasted_;
  this->memory = (uint *)0x0;
  this->sz = 0;
  this->cap = 0;
  this->wasted_ = 0;
  return;
}

Assistant:

void     moveTo(RegionAllocator& to) {
        if (to.memory != NULL) ::free(to.memory);
        to.memory = memory;
        to.sz = sz;
        to.cap = cap;
        to.wasted_ = wasted_;

        memory = NULL;
        sz = cap = wasted_ = 0;
    }